

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

void __thiscall SQArray::Extend(SQArray *this,SQArray *a)

{
  SQUnsignedInteger SVar1;
  SQUnsignedInteger SVar2;
  bool bVar3;
  
  SVar2 = (a->_values)._size;
  if (SVar2 != 0) {
    SVar1 = 0;
    if ((long)SVar2 < 1) {
      SVar2 = SVar1;
    }
    while (bVar3 = SVar2 != 0, SVar2 = SVar2 - 1, bVar3) {
      Append(this,(SQObject *)((long)&(((a->_values)._vals)->super_SQObject)._type + SVar1));
      SVar1 = SVar1 + 0x10;
    }
  }
  return;
}

Assistant:

SQUnsignedInteger TranslateIndex(const SQObjectPtr &idx)
{
    switch(sq_type(idx)){
        case OT_NULL:
            return 0;
        case OT_INTEGER:
            return (SQUnsignedInteger)_integer(idx);
        default: assert(0); break;
    }
    return 0;
}